

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_callback.cc
# Opt level: O0

vector<double,_std::allocator<double>_> *
bidirectional::additiveForwardREF
          (vector<double,_std::allocator<double>_> *cumulative_resource,
          vector<double,_std::allocator<double>_> *edge_resource_consumption)

{
  iterator iVar1;
  iterator iVar2;
  const_iterator cVar3;
  iterator iVar4;
  vector<double,_std::allocator<double>_> *in_RDI;
  vector<double,_std::allocator<double>_> *new_resources;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffd8;
  uint7 in_stack_ffffffffffffffe0;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)(ulong)in_stack_ffffffffffffffe0,
             in_stack_ffffffffffffffd8);
  iVar1 = std::vector<double,_std::allocator<double>_>::begin(in_RDI);
  iVar2 = std::vector<double,_std::allocator<double>_>::end(in_RDI);
  cVar3 = std::vector<double,_std::allocator<double>_>::begin(in_RDI);
  iVar4 = std::vector<double,_std::allocator<double>_>::begin(in_RDI);
  std::
  transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::plus<double>>
            (iVar1._M_current,iVar2._M_current,cVar3._M_current,iVar4._M_current);
  return in_RDI;
}

Assistant:

std::vector<double> additiveForwardREF(
    const std::vector<double>& cumulative_resource,
    const std::vector<double>& edge_resource_consumption) {
  // Add element wise
  std::vector<double> new_resources = cumulative_resource;
  std::transform(
      new_resources.begin(),
      new_resources.end(),
      edge_resource_consumption.begin(),
      new_resources.begin(),
      std::plus<double>());
  return new_resources;
}